

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int lws_sa46_parse_numeric_address(char *ads,lws_sockaddr46 *sa46)

{
  int iVar1;
  int iVar2;
  uint8_t a [16];
  in_addr local_18 [4];
  
  iVar1 = lws_parse_numeric_address(ads,(uint8_t *)local_18,0x10);
  iVar2 = -1;
  if (iVar1 == 4) {
    (sa46->sa4).sin_family = 2;
    (sa46->sa4).sin_addr.s_addr = local_18[0].s_addr;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
lws_sa46_parse_numeric_address(const char *ads, lws_sockaddr46 *sa46)
{
	uint8_t a[16];
	int n;

	n = lws_parse_numeric_address(ads, a, sizeof(a));
	if (n < 0)
		return -1;

#if defined(LWS_WITH_IPV6)
	if (n == 16) {
		sa46->sa6.sin6_family = AF_INET6;
		memcpy(sa46->sa6.sin6_addr.s6_addr, a,
		       sizeof(sa46->sa6.sin6_addr.s6_addr));

		return 0;
	}
#endif

	if (n != 4)
		return -1;

	sa46->sa4.sin_family = AF_INET;
	memcpy(&sa46->sa4.sin_addr.s_addr, a,
	       sizeof(sa46->sa4.sin_addr.s_addr));

	return 0;
}